

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyGuard.h
# Opt level: O0

void __thiscall
Js::JitPolyEquivalentTypeGuard::JitPolyEquivalentTypeGuard
          (JitPolyEquivalentTypeGuard *this,int index,uint32 objTypeSpecFldId)

{
  uintptr_t uVar1;
  uint local_1c;
  uint i;
  uint32 objTypeSpecFldId_local;
  int index_local;
  JitPolyEquivalentTypeGuard *this_local;
  
  JitEquivalentTypeGuard::JitEquivalentTypeGuard
            (&this->super_JitEquivalentTypeGuard,index,objTypeSpecFldId);
  (this->super_JitEquivalentTypeGuard).super_JitIndexedPropertyGuard.super_PropertyGuard.isPoly =
       true;
  local_1c = 0;
  while( true ) {
    uVar1 = GetSize(this);
    if (uVar1 <= local_1c) break;
    this->polyValues[local_1c] = 1;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

JitPolyEquivalentTypeGuard(int index, uint32 objTypeSpecFldId) : JitEquivalentTypeGuard(index, objTypeSpecFldId)
    {
        isPoly = true;

        for (uint i = 0; i < GetSize(); i++)
        {
            polyValues[i] = GuardValue::Uninitialized;
        }
    }